

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::
call_matcher<float_&(float_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<float_&>,_float>_>_>
::run_actions(call_matcher<float_&(float_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<float_&>,_float>_>_>
              *this,call_params_type_t<float_&(float_&)> *params,
             call_matcher_list<float_&(float_&)> *saturated_list)

{
  char *name;
  location loc;
  bool bVar1;
  uint uVar2;
  pointer psVar3;
  side_effect_base<float_&(float_&)> *psVar4;
  tuple<float_&> *t;
  side_effect_base<float_&(float_&)> *a;
  iterator __end0;
  iterator __begin0;
  side_effect_list<float_&(float_&)> *__range2;
  undefined1 local_78 [8];
  unique_lock<std::recursive_mutex> lock;
  string local_58;
  call_params_type_t<float_&(float_&)> *local_38;
  unsigned_long uStack_30;
  call_matcher_list<float_&(float_&)> *local_20;
  call_matcher_list<float_&(float_&)> *saturated_list_local;
  call_params_type_t<float_&(float_&)> *params_local;
  call_matcher<float_&(float_&),_std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<float_&>,_float>_>_>
  *this_local;
  
  local_20 = saturated_list;
  saturated_list_local = (call_matcher_list<float_&(float_&)> *)params;
  params_local = (call_params_type_t<float_&(float_&)> *)this;
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  bVar1 = sequence_handler_base::is_forbidden(psVar3);
  if (bVar1) {
    this->reported = true;
    name = (this->super_call_matcher_base<float_&(float_&)>).name;
    local_38 = (call_params_type_t<float_&(float_&)> *)
               (this->super_call_matcher_base<float_&(float_&)>).loc.file;
    uStack_30 = (this->super_call_matcher_base<float_&(float_&)>).loc.line;
    params_string<float&>(&local_58,(trompeloeil *)saturated_list_local,t);
    loc.line = uStack_30;
    loc.file = (char *)local_38;
    params = local_38;
    report_forbidden_call(name,loc,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  get_lock<void>();
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  uVar2 = (*psVar3->_vptr_sequence_handler_base[3])();
  if ((uVar2 & 1) == 0) {
    psVar3 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator->(&this->sequences);
    params = (call_params_type_t<float_&(float_&)> *)0x0;
    (*psVar3->_vptr_sequence_handler_base[2])
              (psVar3,0,(this->super_call_matcher_base<float_&(float_&)>).name,
               (this->super_call_matcher_base<float_&(float_&)>).loc.file,
               (this->super_call_matcher_base<float_&(float_&)>).loc.line);
  }
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  sequence_handler_base::increment_call(psVar3);
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  bVar1 = sequence_handler_base::is_satisfied(psVar3);
  if (bVar1) {
    psVar3 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator->(&this->sequences);
    (*psVar3->_vptr_sequence_handler_base[6])();
  }
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  bVar1 = sequence_handler_base::is_saturated(psVar3);
  if (bVar1) {
    psVar3 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator->(&this->sequences);
    (*psVar3->_vptr_sequence_handler_base[5])();
    list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>::unlink
              ((list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_> *)this,(char *)params);
    list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>::push_back
              (&local_20->
                super_list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>
               ,&this->super_call_matcher_base<float_&(float_&)>);
  }
  __end0 = list<trompeloeil::side_effect_base<float_&(float_&)>,_trompeloeil::delete_disposer>::
           begin(&this->actions);
  a = (side_effect_base<float_&(float_&)> *)
      list<trompeloeil::side_effect_base<float_&(float_&)>,_trompeloeil::delete_disposer>::end
                (&this->actions);
  while (bVar1 = trompeloeil::operator!=(&__end0,(iterator *)&a), bVar1) {
    psVar4 = list<trompeloeil::side_effect_base<float_&(float_&)>,_trompeloeil::delete_disposer>::
             iterator::operator*(&__end0);
    (**(code **)(*(long *)psVar4 + 0x10))(psVar4,saturated_list_local);
    list<trompeloeil::side_effect_base<float_&(float_&)>,_trompeloeil::delete_disposer>::iterator::
    operator++(&__end0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_78);
  return;
}

Assistant:

void
    run_actions(
      call_params_type_t<Sig>& params,
      call_matcher_list<Sig> &saturated_list)
    override
    {
      if (sequences->is_forbidden())
      {
        reported = true;
        report_forbidden_call(name, loc, params_string(params));
      }
      auto lock = get_lock();
      {
        if (!sequences->can_be_called())
        {
          sequences->validate(severity::fatal, name, loc);
        }
        sequences->increment_call();
        if (sequences->is_satisfied())
        {
          sequences->retire_predecessors();
        }
        if (sequences->is_saturated())
        {
          sequences->retire();
          this->unlink();
          saturated_list.push_back(this);
        }
      }
      for (auto& a : actions) a.action(params);
    }